

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

int re2::CEscapeString(char *src,int src_len,char *dest,int dest_len)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  byte *pbVar5;
  
  if (src_len < 1) {
    iVar4 = 0;
  }
  else {
    pbVar5 = (byte *)(src + src_len);
    iVar4 = 0;
    do {
      if (dest_len - iVar4 < 2) {
        return -1;
      }
      bVar1 = *src;
      if (bVar1 < 0x22) {
        if (bVar1 == 9) {
          (dest + iVar4)[0] = '\\';
          (dest + iVar4)[1] = 't';
          goto LAB_0013c8fd;
        }
        if (bVar1 == 10) {
          (dest + iVar4)[0] = '\\';
          (dest + iVar4)[1] = 'n';
          goto LAB_0013c8fd;
        }
        if (bVar1 == 0xd) {
          (dest + iVar4)[0] = '\\';
          (dest + iVar4)[1] = 'r';
          goto LAB_0013c8fd;
        }
LAB_0013c8c0:
        if ((byte)(bVar1 + 0x81) < 0xa1) {
          if ((uint)(dest_len - iVar4) < 5) {
            return -1;
          }
          snprintf(dest + iVar4,5,"\\%03o");
          iVar4 = iVar4 + 4;
        }
        else {
          lVar3 = (long)iVar4;
          iVar4 = iVar4 + 1;
          dest[lVar3] = bVar1;
        }
      }
      else {
        if (bVar1 == 0x22) {
          (dest + iVar4)[0] = '\\';
          (dest + iVar4)[1] = '\"';
        }
        else if (bVar1 == 0x27) {
          (dest + iVar4)[0] = '\\';
          (dest + iVar4)[1] = '\'';
        }
        else {
          if (bVar1 != 0x5c) goto LAB_0013c8c0;
          (dest + iVar4)[0] = '\\';
          (dest + iVar4)[1] = '\\';
        }
LAB_0013c8fd:
        iVar4 = iVar4 + 2;
      }
      src = (char *)((byte *)src + 1);
    } while (src < pbVar5);
  }
  iVar2 = -1;
  if (iVar4 < dest_len) {
    dest[iVar4] = '\0';
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

int CEscapeString(const char* src, int src_len, char* dest,
                  int dest_len) {
  const char* src_end = src + src_len;
  int used = 0;

  for (; src < src_end; src++) {
    if (dest_len - used < 2)   // space for two-character escape
      return -1;

    unsigned char c = *src;
    switch (c) {
      case '\n': dest[used++] = '\\'; dest[used++] = 'n';  break;
      case '\r': dest[used++] = '\\'; dest[used++] = 'r';  break;
      case '\t': dest[used++] = '\\'; dest[used++] = 't';  break;
      case '\"': dest[used++] = '\\'; dest[used++] = '\"'; break;
      case '\'': dest[used++] = '\\'; dest[used++] = '\''; break;
      case '\\': dest[used++] = '\\'; dest[used++] = '\\'; break;
      default:
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        if (c < ' ' || c > '~') {
          if (dest_len - used < 5)   // space for four-character escape + \0
            return -1;
#if !defined(_WIN32)
          snprintf(dest + used, 5, "\\%03o", c);
#else
          // On Windows, the function takes 4+VA arguments, not 3+VA. With an
          // array, the buffer size will be inferred, but not with a pointer.
          snprintf(dest + used, 5, _TRUNCATE, "\\%03o", c);
#endif
          used += 4;
        } else {
          dest[used++] = c; break;
        }
    }
  }

  if (dest_len - used < 1)   // make sure that there is room for \0
    return -1;

  dest[used] = '\0';   // doesn't count towards return value though
  return used;
}